

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O3

int untrap_prob(trap *ttmp)

{
  bool bVar1;
  boolean bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  
  iVar5 = 0x1e;
  if (youmonst.data == mons + 100) {
    iVar5 = 3;
  }
  if (youmonst.data == mons + 0x62) {
    iVar5 = 3;
  }
  if ((ttmp->field_0x8 & 0x1f) != 0x13) {
    iVar5 = 3;
  }
  if ((u.uprops[0x1c].intrinsic != 0) ||
     (((u.uprops[0x23].intrinsic != 0 && (u.uprops[0x24].extrinsic == 0)) &&
      ((u.umonnum == u.umonster || (bVar2 = dmgtype(youmonst.data,0x24), bVar2 == '\0')))))) {
    iVar5 = iVar5 + 1;
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
      if (((youmonst.data)->mflags1 & 0x1000) == 0) goto LAB_0026eeff;
      goto LAB_0026eef2;
    }
LAB_0026eef7:
    if (ublindf->oartifact == '\x1d') goto LAB_0026eeff;
  }
  else {
LAB_0026eef2:
    if (ublindf != (obj *)0x0) goto LAB_0026eef7;
  }
  iVar5 = iVar5 + 1;
LAB_0026eeff:
  if (((u.uprops[0x1b].intrinsic != 0) || (u.umonnum == 0x9e)) || ((youmonst.data)->mlet == '\x1c'))
  {
    iVar5 = iVar5 + 2;
  }
  uVar4 = (int)((char)ttmp->field_0x8 >> 7) +
          (iVar5 << (u.uprops[0x25].extrinsic != 0 || u.uprops[0x25].intrinsic != 0));
  if (urole.malenum == 0x164) {
    uVar3 = mt_random();
    uVar4 = uVar4 - ((int)(uVar3 % 0x3c) < u.ulevel);
    bVar1 = (bool)(1 < uVar4 & (byte)u.uhave._0_1_ >> 4);
  }
  else {
    bVar1 = urole.malenum == 0x163;
  }
  uVar3 = mt_random();
  return uVar3 % (uVar4 - bVar1);
}

Assistant:

static int untrap_prob(struct trap *ttmp)
{
	int chance = 3;

	/* Only spiders know how to deal with webs reliably */
	if (ttmp->ttyp == WEB && !webmaker(youmonst.data))
	 	chance = 30;
	if (Confusion || Hallucination) chance++;
	if (Blind) chance++;
	if (Stunned) chance += 2;
	if (Fumbling) chance *= 2;
	/* Your own traps are better known than others. */
	if (ttmp->madeby_u) chance--;
	if (Role_if (PM_ROGUE)) {
	    if (rn2(2 * MAXULEV) < u.ulevel) chance--;
	    if (u.uhave.questart && chance > 1) chance--;
	} else if (Role_if (PM_RANGER) && chance > 1) chance--;
	return rn2(chance);
}